

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractSyntaxTree.cpp
# Opt level: O0

void __thiscall MyCompiler::Statement::Statement(Statement *this)

{
  allocator local_31;
  string local_30 [32];
  Statement *local_10;
  Statement *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"Statement",&local_31);
  AbstractAstNode::AbstractAstNode(&this->super_AbstractAstNode,(string *)local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::shared_ptr<MyCompiler::Ident>::shared_ptr(&this->pIdent);
  std::shared_ptr<MyCompiler::Expression>::shared_ptr(&this->pExpression);
  std::shared_ptr<MyCompiler::Condition>::shared_ptr(&this->pCondition);
  std::shared_ptr<MyCompiler::Statement>::shared_ptr(&this->pStatement);
  std::vector<MyCompiler::Ident,_std::allocator<MyCompiler::Ident>_>::vector(&this->vIdent);
  std::vector<MyCompiler::Statement,_std::allocator<MyCompiler::Statement>_>::vector
            (&this->vStatement);
  return;
}

Assistant:

MyCompiler::Statement::Statement()
        : AbstractAstNode("Statement")
{}